

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  pointer pfVar9;
  int i_2;
  long lVar10;
  int i;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  size_type __n;
  int i_7;
  int w;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int target_width;
  int target_height;
  value_type_conflict1 local_3f0;
  allocator_type local_3e9;
  undefined8 local_3e8;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  Extractor ex;
  vector<float,_std::allocator<float>_> x_;
  vector<float,_std::allocator<float>_> all_anchor_points;
  _Vector_base<int,_std::allocator<int>_> local_348;
  float mean_vals1 [3];
  vector<float,_std::allocator<float>_> shift_x;
  vector<float,_std::allocator<float>_> shifted_anchor_points;
  vector<float,_std::allocator<float>_> y_;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  vector<int,_std::allocator<int>_> strides;
  _Vector_base<float,_std::allocator<float>_> local_210;
  undefined1 local_1f8 [32];
  Allocator *local_1d8;
  int local_1cc;
  int local_1c8;
  vector<float,_std::allocator<float>_> anchor_points;
  float norm_vals1 [3];
  undefined4 uStack_17c;
  vector<int,_std::allocator<int>_> pyramid_levels;
  Net net;
  Option opt;
  Mat bgr;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar4 = argv[1];
    std::__cxx11::string::string((string *)&net,pcVar4,(allocator *)local_1f8);
    cv::imread((string *)&bgr,(int)&net);
    std::__cxx11::string::~string((string *)&net);
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Option::Option(&opt);
      opt.num_threads = 4;
      opt.use_vulkan_compute = false;
      opt.use_bf16_storage = false;
      ncnn::Net::Net(&net);
      net.opt.num_threads = opt.num_threads;
      net.opt.lightmode = opt.lightmode;
      net.opt.use_shader_pack8 = opt.use_shader_pack8;
      net.opt.use_subgroup_ops = opt.use_subgroup_ops;
      net.opt.use_reserved_0 = opt.use_reserved_0;
      net.opt.use_vulkan_compute = opt.use_vulkan_compute;
      net.opt.openmp_blocktime = opt.openmp_blocktime;
      net.opt.use_winograd_convolution = opt.use_winograd_convolution;
      net.opt.use_sgemm_convolution = opt.use_sgemm_convolution;
      net.opt.use_int8_inference = opt.use_int8_inference;
      net.opt.use_fp16_packed = opt.use_fp16_packed;
      net.opt.use_fp16_storage = opt.use_fp16_storage;
      net.opt.use_fp16_arithmetic = opt.use_fp16_arithmetic;
      net.opt.use_int8_packed = opt.use_int8_packed;
      net.opt.use_int8_storage = opt.use_int8_storage;
      net.opt.use_int8_arithmetic = opt.use_int8_arithmetic;
      net.opt.use_packing_layout = opt.use_packing_layout;
      net.opt.use_bf16_storage = opt.use_bf16_storage;
      net.opt.flush_denormals = opt.flush_denormals;
      net.opt.use_local_pool_allocator = opt.use_local_pool_allocator;
      net.opt.use_shader_local_memory = opt.use_shader_local_memory;
      net.opt.use_cooperative_matrix = opt.use_cooperative_matrix;
      net.opt.use_winograd23_convolution = opt.use_winograd23_convolution;
      net.opt.use_winograd43_convolution = opt.use_winograd43_convolution;
      net.opt.use_winograd63_convolution = opt.use_winograd63_convolution;
      net.opt.use_a53_a55_optimized_kernel = opt.use_a53_a55_optimized_kernel;
      net.opt.use_fp16_uniform = opt.use_fp16_uniform;
      net.opt.use_int8_uniform = opt.use_int8_uniform;
      net.opt.use_reserved_9 = opt.use_reserved_9;
      net.opt.use_reserved_10 = opt.use_reserved_10;
      net.opt.use_reserved_11 = opt.use_reserved_11;
      net.opt.vulkan_device_index = opt.vulkan_device_index;
      net.opt.use_reserved_1 = opt.use_reserved_1;
      net.opt.use_image_storage = opt.use_image_storage;
      net.opt.use_tensor_storage = opt.use_tensor_storage;
      net.opt.use_reserved_2 = opt.use_reserved_2;
      net.opt.workspace_allocator = opt.workspace_allocator;
      net.opt.blob_allocator = opt.blob_allocator;
      iVar8 = ncnn::Net::load_param(&net,"p2pnet.param");
      if ((iVar8 != 0) || (iVar8 = ncnn::Net::load_model(&net,"p2pnet.bin"), iVar8 != 0)) {
        exit(-1);
      }
      iVar8 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      target_width = (w / 0x80) * 0x80;
      target_height = (iVar8 / 0x80) * 0x80;
      ncnn::Mat::from_pixels_resize
                ((Mat *)local_1f8,local_80,0x10002,w,iVar8,target_width,target_height,
                 (Allocator *)0x0);
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = 3;
      std::vector<int,_std::allocator<int>_>::vector
                (&pyramid_levels,1,(value_type_conflict *)&x_,(allocator_type *)&y_);
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_348,&pyramid_levels);
      _norm_vals1 = (undefined1  [16])0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar19 = 0;
          uVar19 < (ulong)((long)local_348._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_348._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar19 = uVar19 + 1) {
        dVar20 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        local_3e8._0_4_ = SUB84(dVar20,0);
        local_3e8._4_4_ = (float)((ulong)dVar20 >> 0x20);
        dVar20 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        dVar20 = floor(((double)CONCAT44(local_3e8._4_4_,(float)local_3e8) + (double)local_1c8 +
                       -1.0) / dVar20);
        local_3e8._0_4_ = SUB84(dVar20,0);
        local_3e8._4_4_ = (float)((ulong)dVar20 >> 0x20);
        dVar21 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        dVar22 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        dVar20 = (double)CONCAT44(local_3e8._4_4_,(float)local_3e8);
        dVar21 = floor((dVar21 + (double)local_1cc + -1.0) / dVar22);
        auVar6 = (undefined1  [16])
                 x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._0_16_;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = (int)dVar20;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (int)dVar21;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = auVar6._8_8_;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)norm_vals1,
                   (pair<int,_int> *)&x_);
        dVar20 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (int)dVar20;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&strides,(int *)&x_);
      }
      if (all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      uVar19 = 0;
      while( true ) {
        if ((ulong)((long)local_348._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_348._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar19) break;
        anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar20 = ldexp(1.0,local_348._M_impl.super__Vector_impl_data._M_start[uVar19]);
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
        local_3e8 = (double)((float)(int)dVar20 * 0.5);
        for (iVar11 = 1; iVar11 != 3; iVar11 = iVar11 + 1) {
          shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(shift_x.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (float)(((double)iVar11 + -0.5) * local_3e8 +
                                              -(double)((int)dVar20 / 2)));
          std::vector<float,_std::allocator<float>_>::push_back
                    (&x_,(value_type_conflict1 *)
                         &shift_x.super__Vector_base<float,_std::allocator<float>_>);
        }
        for (iVar11 = 1; iVar11 != 3; iVar11 = iVar11 + 1) {
          shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(shift_x.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (float)(((double)iVar11 + -0.5) * local_3e8 +
                                              -(double)((int)dVar20 / 2)));
          std::vector<float,_std::allocator<float>_>::push_back
                    (&y_,(value_type_conflict1 *)
                         &shift_x.super__Vector_base<float,_std::allocator<float>_>);
        }
        ex._vptr_Extractor._0_4_ = 0;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   &shift_x.super__Vector_base<float,_std::allocator<float>_>,4,
                   (value_type_conflict1 *)&ex,(allocator_type *)mean_vals1);
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&ex,4,(value_type_conflict1 *)mean_vals1
                   ,(allocator_type *)&shifted_anchor_points);
        pfVar9 = shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
            pfVar9[lVar14] =
                 x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
          }
          pfVar9 = pfVar9 + 2;
        }
        lVar10 = CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_);
        for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
          for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
            *(float *)(lVar10 + lVar15 * 4) =
                 y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
          }
          lVar10 = lVar10 + 8;
        }
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::resize
                  (&anchor_points,8,(value_type_conflict1 *)mean_vals1);
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          fVar2 = *(float *)(CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) +
                            lVar10 * 4);
          anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10 * 2] =
               shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
          anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10 * 2 + 1] = fVar2;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&ex);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&shift_x.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&y_.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&x_.super__Vector_base<float,_std::allocator<float>_>);
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar3 = *(uint *)(norm_vals1._0_8_ + uVar19 * 8);
        fVar2 = *(float *)(norm_vals1._0_8_ + 4 + uVar19 * 8);
        iVar11 = strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19];
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_210,&anchor_points);
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_
             = ZEXT816(0);
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        local_3e8 = (double)iVar11;
        uVar12 = 0;
        uVar18 = 0;
        if (0 < (int)uVar3) {
          uVar18 = uVar3;
        }
        for (; uVar18 != uVar12; uVar12 = uVar12 + 1) {
          shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(shift_x.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (float)(((double)(int)uVar12 + 0.5) * local_3e8));
          std::vector<float,_std::allocator<float>_>::push_back
                    (&x_,(value_type_conflict1 *)
                         &shift_x.super__Vector_base<float,_std::allocator<float>_>);
        }
        iVar11 = 0;
        uVar13 = 0;
        if (0 < (int)fVar2) {
          uVar13 = (ulong)(uint)fVar2;
        }
        for (; (int)uVar13 != iVar11; iVar11 = iVar11 + 1) {
          shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(shift_x.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (float)(((double)iVar11 + 0.5) * local_3e8));
          std::vector<float,_std::allocator<float>_>::push_back
                    (&y_,(value_type_conflict1 *)
                         &shift_x.super__Vector_base<float,_std::allocator<float>_>);
        }
        local_3e8._4_4_ = (float)((int)fVar2 >> 0x1f);
        __n = (long)(int)fVar2 * (long)(int)uVar3;
        ex._vptr_Extractor._0_4_ = 0;
        local_3e8._0_4_ = fVar2;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   &shift_x.super__Vector_base<float,_std::allocator<float>_>,__n,
                   (value_type_conflict1 *)&ex,(allocator_type *)mean_vals1);
        mean_vals1._0_8_ = mean_vals1._0_8_ & 0xffffffff00000000;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&ex,__n,
                   (value_type_conflict1 *)mean_vals1,(allocator_type *)&local_3f0);
        fVar2 = (float)local_3e8;
        lVar10 = (long)(int)uVar3 * 4;
        lVar14 = 0;
        for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
          for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar17 * 4 + lVar14) =
                 x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
          }
          lVar14 = lVar14 + lVar10;
        }
        lVar14 = 0;
        for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
          for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)(CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) + lVar14 +
                      uVar17 * 4) =
                 y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16];
          }
          lVar14 = lVar14 + lVar10;
        }
        local_3f0 = 0.0;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)mean_vals1,__n * 2,&local_3f0,&local_3e9
                  );
        uVar18 = uVar3 * (int)fVar2;
        if ((int)(uVar3 * (int)fVar2) < 1) {
          uVar18 = 0;
        }
        for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)(mean_vals1._0_8_ + uVar13 * 8) =
               shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
          *(undefined4 *)(mean_vals1._0_8_ + 4 + uVar13 * 8) =
               *(undefined4 *)
                (CONCAT44(ex._vptr_Extractor._4_4_,ex._vptr_Extractor._0_4_) + uVar13 * 4);
        }
        local_3f0 = 0.0;
        std::vector<float,_std::allocator<float>_>::resize
                  (&shifted_anchor_points,
                   __n * ((long)local_210._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_210._M_impl.super__Vector_impl_data._M_start >> 2) &
                   0x7fffffffffffffff,&local_3f0);
        uVar13 = (long)local_210._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_210._M_impl.super__Vector_impl_data._M_start >> 2;
        lVar10 = 0;
        for (uVar16 = 0; uVar16 != uVar18; uVar16 = uVar16 + 1) {
          lVar14 = lVar10;
          for (uVar17 = 0; uVar13 >> 1 != uVar17; uVar17 = uVar17 + 1) {
            fVar2 = local_210._M_impl.super__Vector_impl_data._M_start[uVar17 * 2 + 1];
            fVar1 = *(float *)(mean_vals1._0_8_ + (uVar16 * 2 + 1) * 4);
            *(float *)((long)shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                      uVar17 * 8 + (lVar10 * 4 & 0xfffffffffffffff8U)) =
                 local_210._M_impl.super__Vector_impl_data._M_start[uVar17 * 2] +
                 *(float *)(mean_vals1._0_8_ + uVar16 * 8);
            *(float *)((long)shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>
                             ._M_impl.super__Vector_impl_data._M_start + (lVar14 * 4 | 4U)) =
                 fVar2 + fVar1;
            lVar14 = lVar14 + 2;
          }
          lVar10 = lVar10 + uVar13;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)mean_vals1);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&ex);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&shift_x.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&y_.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&x_.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_210);
        std::vector<float,std::allocator<float>>::
        insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
                  ((vector<float,std::allocator<float>> *)&all_anchor_points,
                   (const_iterator)
                   all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&shifted_anchor_points.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&anchor_points.super__Vector_base<float,_std::allocator<float>_>);
        uVar19 = uVar19 + 1;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&strides.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 norm_vals1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_348);
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = all_anchor_points.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x4;
      ncnn::Net::create_extractor((Net *)&ex);
      mean_vals1[0] = 123.675;
      mean_vals1[1] = 116.28;
      mean_vals1[2] = 103.53;
      norm_vals1[2] = 0.01742919;
      norm_vals1[0] = 0.01712475;
      norm_vals1[1] = 0.0175;
      ncnn::Mat::substract_mean_normalize((Mat *)local_1f8,mean_vals1,norm_vals1);
      ncnn::Extractor::input(&ex,"input",(Mat *)local_1f8);
      ncnn::Extractor::input(&ex,"anchor",(Mat *)&x_);
      y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
      ._0_4_ = 0;
      y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
      ._4_4_ = 0;
      y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      ncnn::Extractor::extract(&ex,"pred_scores",(Mat *)&y_,0);
      ncnn::Extractor::extract(&ex,"pred_points",(Mat *)&shift_x,0);
      local_3e8._0_4_ = (float)target_width;
      local_3e8._4_4_ = (float)target_height;
      uStack_3e0 = 0;
      uStack_3dc = 0;
      for (lVar10 = 0;
          auVar6 = (undefined1  [16])
                   strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._0_16_, lVar10 < 0; lVar10 = lVar10 + 1) {
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             *(ulong *)shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        auVar24._4_4_ = local_3e8._4_4_;
        auVar24._0_4_ = (float)local_3e8;
        auVar24._8_4_ = uStack_3e0;
        auVar24._12_4_ = uStack_3dc;
        auVar24 = divps(auVar23,auVar24);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = (int)(auVar24._4_4_ * (float)iVar8);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (int)(auVar24._0_4_ * (float)w);
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = auVar6._12_4_;
        strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start[1];
        std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::push_back
                  (&crowd_points,(value_type *)&strides);
      }
      piVar5 = (int *)CONCAT44(shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          free(shift_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      piVar5 = (int *)CONCAT44(y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          free(y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start);
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish != (pointer)0x0) {
        LOCK();
        *x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = (float)((int)*x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish + -1);
        UNLOCK();
        if (*x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish == 0.0) {
          free(x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_anchor_points.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&pyramid_levels.super__Vector_base<int,_std::allocator<int>_>);
      if ((int *)local_1f8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_1f8._8_8_ == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free((void *)local_1f8._0_8_);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&net);
      cv::Mat::clone();
      lVar10 = 8;
      for (uVar19 = 0;
          uVar19 < (ulong)(((long)crowd_points.
                                  super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)crowd_points.
                                 super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0xc); uVar19 = uVar19 + 1) {
        if (0.5 < *(float *)((long)&((crowd_points.
                                      super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->pt).x + lVar10)) {
          x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = 0x3010000;
          x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)&net;
          y_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      ((long)crowd_points.
                             super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -8);
          cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_1f8);
          local_1f8._0_8_ = (void *)0x0;
          local_1f8._8_8_ = (int *)0x0;
          local_1f8._16_8_ = 255.0;
          local_1f8._24_8_ = 0.0;
          cv::circle(&x_,&y_,4,(Matx<double,_4,_1> *)local_1f8,0xffffffff,8,0);
        }
        lVar10 = lVar10 + 0xc;
      }
      std::__cxx11::string::string((string *)local_1f8,"image",(allocator *)&shift_x);
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = 0x1010000;
      x_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)&net;
      cv::imshow((string *)local_1f8,(_InputArray *)&x_);
      std::__cxx11::string::~string((string *)local_1f8);
      iVar8 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&net);
      std::_Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>::~_Vector_base
                (&crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar4);
      iVar8 = -1;
    }
    cv::Mat::~Mat(&bgr);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}